

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo.c
# Opt level: O3

int eynorr(char *sp)

{
  uint uVar1;
  int iVar2;
  
  if (inmacro == 0) {
    ewprintf("%s? (y, n or r) ",sp);
    while (uVar1 = getkey(0), (int)uVar1 < 0x59) {
      if (uVar1 == 0xd) {
LAB_0010c00c:
        eerase();
        return 0;
      }
      if (uVar1 == 0x20) goto LAB_0010c015;
      if (uVar1 == 0x4e) goto LAB_0010c00c;
LAB_0010bff1:
      if ((uVar1 & 0xffffffdf) == 0x52) {
        eerase();
        return 4;
      }
      if (uVar1 == 7) {
        eerase();
        iVar2 = ctrlg(8,1);
        return iVar2;
      }
      ewprintf("Please answer y, n or r.");
    }
    if (uVar1 != 0x79) {
      if (uVar1 == 0x6e) goto LAB_0010c00c;
      if (uVar1 != 0x59) goto LAB_0010bff1;
    }
LAB_0010c015:
    eerase();
  }
  return 1;
}

Assistant:

int
eynorr(const char *sp)
{
	int	 s;

	if (inmacro)
		return (TRUE);

	ewprintf("%s? (y, n or r) ", sp);
	for (;;) {
		s = getkey(FALSE);
		if (s == 'y' || s == 'Y' || s == ' ') {
			eerase();
			return (TRUE);
		}
		if (s == 'n' || s == 'N' || s == CCHR('M')) {
			eerase();
			return (FALSE);
		}
		if (s == 'r' || s == 'R') {
			eerase();
			return (REVERT);
		}
		if (s == CCHR('G')) {
			eerase();
			return (ctrlg(FFRAND, 1));
		}
		ewprintf("Please answer y, n or r.");
	}
	/* NOTREACHED */
}